

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

idx_t duckdb::ListVector::GetListSize(Vector *vec)

{
  VectorType VVar1;
  VectorBuffer *pVVar2;
  
  VVar1 = vec->vector_type;
  while (VVar1 == DICTIONARY_VECTOR) {
    DictionaryVector::VerifyDictionary(vec);
    pVVar2 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vec->auxiliary);
    vec = (Vector *)(pVVar2 + 1);
    VVar1 = *(VectorType *)&pVVar2[1]._vptr_VectorBuffer;
  }
  pVVar2 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vec->auxiliary);
  return (idx_t)pVVar2[1].aux_data.
                super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
}

Assistant:

idx_t ListVector::GetListSize(const Vector &vec) {
	if (vec.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		auto &child = DictionaryVector::Child(vec);
		return ListVector::GetListSize(child);
	}
	D_ASSERT(vec.auxiliary);
	return vec.auxiliary->Cast<VectorListBuffer>().GetSize();
}